

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

char __thiscall World::TileToCharacter(World *this,Tiles *tile)

{
  code *pcVar1;
  TileType TVar2;
  TileType tileData;
  Tiles *tile_local;
  World *this_local;
  
  TVar2 = Tiles::getData(tile);
  switch(TVar2) {
  case WATER:
    this_local._7_1_ = 'S';
    break;
  case GRASS:
    this_local._7_1_ = ',';
    break;
  case PATH:
    this_local._7_1_ = '#';
    break;
  case MOUNTAIN:
    this_local._7_1_ = '^';
    break;
  case FOREST:
    this_local._7_1_ = 'Y';
    break;
  case EMPTY:
    this_local._7_1_ = '~';
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return this_local._7_1_;
}

Assistant:

char World::TileToCharacter(Tiles tile)
{
	TileType tileData = tile.getData();

	switch(tileData)
	{
		case WATER:
			return 'S';
		case GRASS:
			return ',';
		case PATH:
			return '#';
		case MOUNTAIN:
			return '^';
		case FOREST:
			return 'Y';
		case EMPTY:
			return '~';
	}

}